

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

int check_const_addr_p(c2m_ctx_t c2m_ctx,node_t_conflict r,node_t_conflict *base,mir_llong *offset,
                      int *deref)

{
  ulong uVar1;
  node_code_t nVar2;
  byte *pbVar3;
  check_ctx *pcVar4;
  type *ptVar5;
  node_t pnVar6;
  void *pvVar7;
  node_t_conflict pnVar8;
  int *piVar9;
  int iVar10;
  uint uVar11;
  mir_size_t mVar12;
  long lVar13;
  node_t r_00;
  type *ptVar14;
  ulong uVar15;
  node_t local_38;
  
  do {
    pbVar3 = (byte *)r->attr;
    pcVar4 = c2m_ctx->check_ctx;
    if ((*pbVar3 & 1) != 0) {
      iVar10 = *(int *)(*(long *)(pbVar3 + 0x18) + 0x18);
      if (iVar10 == 1) {
        if (0xfffffff3 < *(int *)(*(long *)(pbVar3 + 0x18) + 0x30) - 0xeU) goto LAB_001879c8;
      }
      else if (iVar10 == 2) {
LAB_001879c8:
        *base = (node_t_conflict)0x0;
        *offset = *(mir_llong *)(pbVar3 + 0x30);
        goto LAB_001879dc;
      }
    }
    nVar2 = r->code;
    if (nVar2 != N_CAST) {
      if ((int)nVar2 < 0x28) {
        if (nVar2 - N_STR < 3) {
          *base = r;
          *offset = 0;
          *deref = 0;
          return (uint)(pcVar4->curr_scope == c2m_ctx->top_scope);
        }
        if (nVar2 != N_ID) {
          return 0;
        }
        pnVar8 = *(node_t_conflict *)(pbVar3 + 0x10);
        if (pnVar8 == (node_t_conflict)0x0) {
          return 0;
        }
        if ((pnVar8->code == N_FUNC_DEF) ||
           ((pnVar8->code == N_SPEC_DECL &&
            (*(int *)(*(long *)((long)pnVar8->attr + 0x40) + 0x18) == 7)))) {
          *base = pnVar8;
          uVar11 = 0;
        }
        else {
          if (*(long *)(pbVar3 + 8) == 0) {
            return 0;
          }
          lVar13 = *(long *)(*(long *)(pbVar3 + 8) + 8);
          if ((*(node_t_conflict *)(lVar13 + 0x18) != c2m_ctx->top_scope) &&
             (*(int *)(lVar13 + 0x38) != 0)) {
            return 0;
          }
          *base = pnVar8;
          uVar11 = (uint)(*(long *)(*(long *)(pbVar3 + 0x18) + 8) == 0);
        }
        *deref = uVar11;
        *offset = 0;
        return 1;
      }
      switch(nVar2) {
      case N_ADD:
      case N_SUB:
        pnVar6 = (r->u).ops.head;
        if (pnVar6 == (node_t)0x0) {
          return 0;
        }
        local_38 = (pnVar6->op_link).next;
        if (local_38 == (node_t)0x0) {
          return 0;
        }
        r_00 = pnVar6;
        if ((nVar2 == N_ADD) && ((*pnVar6->attr & 1) != 0)) {
          r_00 = local_38;
          local_38 = pnVar6;
        }
        iVar10 = check_const_addr_p(c2m_ctx,r_00,base,offset,deref);
        if (iVar10 == 0) {
          return 0;
        }
        if ((*deref != 0) && (*(long *)(*(long *)((long)r_00->attr + 0x18) + 8) == 0)) {
          return 0;
        }
        pbVar3 = (byte *)local_38->attr;
        if ((*pbVar3 & 1) == 0) {
          if ((*pbVar3 & 2) == 0) {
            return 0;
          }
          if (*(int **)(pbVar3 + 0x10) == (int *)0x0) {
            return 0;
          }
          if (**(int **)(pbVar3 + 0x10) != 0x53) {
            return 0;
          }
        }
        lVar13 = *(long *)((long)r->attr + 0x18);
        uVar11 = *(uint *)(lVar13 + 0x18);
        mVar12 = (mir_size_t)uVar11;
        if (mVar12 != 1) {
          if (uVar11 != 3) {
            __assert_fail("type->mode == TM_BASIC || type->mode == TM_PTR",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x1d85,
                          "int check_const_addr_p(c2m_ctx_t, node_t, node_t *, mir_llong *, int *)")
            ;
          }
          ptVar5 = *(type **)(lVar13 + 0x30);
          mVar12 = 1;
          if (ptVar5->mode != TM_FUNC) {
            ptVar14 = ptVar5->arr_type;
            if (ptVar5->arr_type == (type *)0x0) {
              ptVar14 = ptVar5;
            }
            mVar12 = raw_type_size(c2m_ctx,ptVar14);
            uVar15 = (ulong)ptVar14->align;
            if (uVar15 != 0) {
              uVar1 = (mVar12 - 1) + uVar15;
              mVar12 = uVar1 - uVar1 % uVar15;
            }
          }
        }
        lVar13 = -(mVar12 * *(long *)(pbVar3 + 0x30));
        if (r->code == N_ADD) {
          lVar13 = mVar12 * *(long *)(pbVar3 + 0x30);
        }
        *offset = *offset + lVar13;
        return 1;
      case N_ADD_ASSIGN:
      case N_SUB_ASSIGN:
      case N_MUL:
      case N_MUL_ASSIGN:
      case N_DIV:
      case N_DIV_ASSIGN:
      case N_MOD:
      case N_MOD_ASSIGN:
        return 0;
      case N_IND:
        pnVar8 = (r->u).ops.head;
        if (*(int *)(*(long *)((long)pnVar8->attr + 0x18) + 0x18) != 3) {
          return 0;
        }
        iVar10 = check_const_addr_p(c2m_ctx,pnVar8,base,offset,deref);
        if (iVar10 != 0) {
          pbVar3 = (byte *)((((r->u).ops.head)->op_link).next)->attr;
          if ((*pbVar3 & 1) != 0) {
            ptVar5 = *(type **)((long)r->attr + 0x18);
            ptVar14 = ptVar5->arr_type;
            if (ptVar14 == (type *)0x0) {
              ptVar14 = ptVar5;
            }
            mVar12 = raw_type_size(c2m_ctx,ptVar14);
            uVar15 = (ulong)ptVar14->align;
            if (uVar15 != 0) {
              uVar1 = (mVar12 - 1) + uVar15;
              mVar12 = uVar1 - uVar1 % uVar15;
            }
            *deref = 1;
            *offset = *offset + mVar12 * *(long *)(pbVar3 + 0x30);
            return 1;
          }
          return 0;
        }
        return 0;
      case N_FIELD:
      case N_DEREF_FIELD:
        iVar10 = check_const_addr_p(c2m_ctx,(r->u).ops.head,base,offset,deref);
        if (iVar10 == 0) {
          return 0;
        }
        if (*deref == (uint)(r->code == N_FIELD)) {
          *deref = 1;
          lVar13 = *(long *)((long)r->attr + 8);
          if (lVar13 != 0) {
            *offset = *offset + *(long *)(*(long *)(lVar13 + 8) + 0x10);
            return 1;
          }
          return 1;
        }
        return 0;
      case N_ADDR:
      case N_DEREF:
        pnVar8 = (r->u).ops.head;
        pvVar7 = pnVar8->attr;
        iVar10 = check_const_addr_p(c2m_ctx,pnVar8,base,offset,deref);
        if (iVar10 == 0) {
          return 0;
        }
        if (r->code == N_ADDR) {
          lVar13 = *(long *)((long)pvVar7 + 0x18);
          iVar10 = *(int *)(lVar13 + 0x18);
          if ((iVar10 == 6) || ((iVar10 == 3 && (*(long *)(lVar13 + 8) != 0)))) {
            if (0 < *deref) {
              *deref = *deref + -1;
              return 1;
            }
            return 1;
          }
        }
        if (pnVar8->code == N_ID) {
          piVar9 = *(int **)((long)pvVar7 + 0x10);
          iVar10 = *piVar9;
          if (iVar10 == 0x7d) {
            return 1;
          }
          if ((iVar10 == 0x55) && (*(int *)(*(long *)(*(long *)(piVar9 + 2) + 0x40) + 0x18) == 7)) {
            return 1;
          }
        }
        if (r->code == N_DEREF) {
          iVar10 = *deref + 1;
        }
        else {
          iVar10 = *deref + -1;
        }
        *deref = iVar10;
        return 1;
      default:
        if (nVar2 != N_LABEL_ADDR) {
          return 0;
        }
        *base = r;
        *offset = 0;
      }
LAB_001879dc:
      *deref = 0;
      return 1;
    }
    ptVar5 = *(type **)((long)((r->u).ops.head)->attr + 0x18);
    mVar12 = raw_type_size(c2m_ctx,ptVar5);
    uVar15 = (ulong)ptVar5->align;
    if (uVar15 != 0) {
      uVar1 = (mVar12 - 1) + uVar15;
      mVar12 = uVar1 - uVar1 % uVar15;
    }
    if (mVar12 != 8) {
      return 0;
    }
    pnVar6 = (r->u).ops.head;
    r = (node_t_conflict)0x0;
    if (pnVar6 != (node_t)0x0) {
      r = (pnVar6->op_link).next;
    }
  } while( true );
}

Assistant:

static int check_const_addr_p (c2m_ctx_t c2m_ctx, node_t r, node_t *base, mir_llong *offset,
                               int *deref) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;
  struct expr *e = r->attr;
  struct type *type;
  node_t op1, op2, temp;
  decl_t decl;
  struct decl_spec *decl_spec;
  mir_size_t size;

  if (e->const_p && integer_type_p (e->type)) {
    *base = NULL;
    *offset = (mir_size_t) e->c.u_val;
    *deref = 0;
    return TRUE;
  }
  switch (r->code) {
  case N_STR:
  case N_STR16:
  case N_STR32:
    *base = r;
    *offset = 0;
    *deref = 0;
    return curr_scope == top_scope;
  case N_LABEL_ADDR:
    *base = r;
    *offset = 0;
    *deref = 0;
    return TRUE;
  case N_ID:
    if (e->def_node == NULL)
      return FALSE;
    else if (e->def_node->code == N_FUNC_DEF
             || (e->def_node->code == N_SPEC_DECL
                 && ((decl_t) e->def_node->attr)->decl_spec.type->mode == TM_FUNC)) {
      *base = e->def_node;
      *deref = 0;
    } else if (e->u.lvalue_node == NULL
               || ((decl = e->u.lvalue_node->attr)->scope != top_scope
                   && decl->decl_spec.linkage != N_IGNORE)) {
      return FALSE;
    } else {
      *base = e->def_node;
      *deref = e->type->arr_type == NULL;
    }
    *offset = 0;
    return TRUE;
  case N_DEREF:
  case N_ADDR: {
    node_t op = NL_HEAD (r->u.ops);
    struct expr *op_e = op->attr;

    if (!check_const_addr_p (c2m_ctx, op, base, offset, deref)) return FALSE;
    if (r->code == N_ADDR
        && (op_e->type->mode == TM_ARR
            || (op_e->type->mode == TM_PTR && op_e->type->arr_type != NULL))) {
      if (*deref > 0) (*deref)--;
    } else if (op->code != N_ID
               || (op_e->def_node->code != N_FUNC_DEF
                   && (op_e->def_node->code != N_SPEC_DECL
                       || ((decl_t) op_e->def_node->attr)->decl_spec.type->mode != TM_FUNC))) {
      r->code == N_DEREF ? (*deref)++ : (*deref)--;
    }
    return TRUE;
  }
  case N_FIELD:
  case N_DEREF_FIELD:
    if (!check_const_addr_p (c2m_ctx, NL_HEAD (r->u.ops), base, offset, deref)) return FALSE;
    if (*deref != (r->code == N_FIELD ? 1 : 0)) return FALSE;
    *deref = 1;
    e = r->attr;
    if (e->u.lvalue_node != NULL) {
      decl = e->u.lvalue_node->attr;
      *offset += decl->offset;
    }
    return TRUE;
  case N_IND:
    if (((struct expr *) NL_HEAD (r->u.ops)->attr)->type->mode != TM_PTR) return FALSE;
    if (!check_const_addr_p (c2m_ctx, NL_HEAD (r->u.ops), base, offset, deref)) return FALSE;
    if (!(e = NL_EL (r->u.ops, 1)->attr)->const_p) return FALSE;
    type = ((struct expr *) r->attr)->type;
    size = type_size (c2m_ctx, type->arr_type != NULL ? type->arr_type : type);
    *deref = 1;
    *offset += e->c.i_val * size;
    return TRUE;
  case N_ADD:
  case N_SUB:
    if ((op2 = NL_EL (r->u.ops, 1)) == NULL) return FALSE;
    op1 = NL_HEAD (r->u.ops);
    if (r->code == N_ADD && (e = op1->attr)->const_p) SWAP (op1, op2, temp);
    if (!check_const_addr_p (c2m_ctx, op1, base, offset, deref)) return FALSE;
    if (*deref != 0 && ((struct expr *) op1->attr)->type->arr_type == NULL) return FALSE;
    if (!(e = op2->attr)->const_p
        && (!e->const_addr_p || e->def_node == NULL || e->def_node->code != N_LABEL_ADDR))
      return FALSE;
    type = ((struct expr *) r->attr)->type;
    assert (type->mode == TM_BASIC || type->mode == TM_PTR);
    size = (type->mode == TM_BASIC || type->u.ptr_type->mode == TM_FUNC
              ? 1
              : type_size (c2m_ctx, type->u.ptr_type->arr_type != NULL ? type->u.ptr_type->arr_type
                                                                       : type->u.ptr_type));
    if (r->code == N_ADD)
      *offset += e->c.i_val * size;
    else
      *offset -= e->c.i_val * size;
    return TRUE;
  case N_CAST:
    decl_spec = NL_HEAD (r->u.ops)->attr;
    if (type_size (c2m_ctx, decl_spec->type) != sizeof (mir_size_t)) return FALSE;
    return check_const_addr_p (c2m_ctx, NL_EL (r->u.ops, 1), base, offset, deref);
  default: return FALSE;
  }
}